

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_sparse_feedback_temporaries
          (CompilerGLSL *this,uint32_t result_type_id,uint32_t id,uint32_t *feedback_id,
          uint32_t *texel_id)

{
  uint32_t uVar1;
  CompilerError *pCVar2;
  mapped_type *pmVar3;
  SPIRType *pSVar4;
  size_t sVar5;
  TypedID *pTVar6;
  SPIRType *return_type;
  mapped_type *temps;
  string local_58;
  uint32_t *local_28;
  uint32_t *texel_id_local;
  uint32_t *feedback_id_local;
  uint32_t id_local;
  uint32_t result_type_id_local;
  CompilerGLSL *this_local;
  
  local_28 = texel_id;
  texel_id_local = feedback_id;
  feedback_id_local._0_4_ = id;
  feedback_id_local._4_4_ = result_type_id;
  _id_local = this;
  if (((this->options).es & 1U) != 0) {
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar2,"Sparse texture feedback is not supported on ESSL.");
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_58,"GL_ARB_sparse_texture2",(allocator *)((long)&temps + 7));
  require_extension_internal(this,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&temps + 7));
  pmVar3 = ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->extra_sub_expressions,(key_type *)&feedback_id_local);
  if (*pmVar3 == 0) {
    uVar1 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
    *pmVar3 = uVar1;
  }
  *texel_id_local = *pmVar3;
  *local_28 = *pmVar3 + 1;
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,feedback_id_local._4_4_);
  if (pSVar4->basetype == Struct) {
    sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(pSVar4->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    if (sVar5 == 2) {
      pTVar6 = (TypedID *)
               VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         (&(pSVar4->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,0);
      uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar6);
      emit_uninitialized_temporary(this,uVar1,*texel_id_local);
      pTVar6 = (TypedID *)
               VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         (&(pSVar4->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,1);
      uVar1 = TypedID::operator_cast_to_unsigned_int(pTVar6);
      emit_uninitialized_temporary(this,uVar1,*local_28);
      return;
    }
  }
  pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(pCVar2,"Invalid return type for sparse feedback.");
  __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerGLSL::emit_sparse_feedback_temporaries(uint32_t result_type_id, uint32_t id, uint32_t &feedback_id,
                                                    uint32_t &texel_id)
{
	// Need to allocate two temporaries.
	if (options.es)
		SPIRV_CROSS_THROW("Sparse texture feedback is not supported on ESSL.");
	require_extension_internal("GL_ARB_sparse_texture2");

	auto &temps = extra_sub_expressions[id];
	if (temps == 0)
		temps = ir.increase_bound_by(2);

	feedback_id = temps + 0;
	texel_id = temps + 1;

	auto &return_type = get<SPIRType>(result_type_id);
	if (return_type.basetype != SPIRType::Struct || return_type.member_types.size() != 2)
		SPIRV_CROSS_THROW("Invalid return type for sparse feedback.");
	emit_uninitialized_temporary(return_type.member_types[0], feedback_id);
	emit_uninitialized_temporary(return_type.member_types[1], texel_id);
}